

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::
allocator_type<cs_impl::any::holder<std::_Ios_Openmode>,_64UL,_cs_impl::default_allocator_provider>
::free(allocator_type<cs_impl::any::holder<std::_Ios_Openmode>,_64UL,_cs_impl::default_allocator_provider>
       *this,void *__ptr)

{
  size_t sVar1;
  
  (*(code *)**__ptr)(__ptr);
  if ((this->mOffset < 0x40) && (global_thread_counter == 0)) {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 + 1;
    this->mPool[sVar1] = (holder<std::_Ios_Openmode> *)__ptr;
    return;
  }
  operator_delete(__ptr,0x10);
  return;
}

Assistant:

inline void free(T *ptr)
		{
			mAlloc.destroy(ptr);
			if (mOffset < blck_size && global_thread_counter == 0)
				mPool[mOffset++] = ptr;
			else
				mAlloc.deallocate(ptr, 1);
		}